

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O0

int rtosc_arg_vals_eq_after_abort
              (rtosc_arg_val_itr *litr,rtosc_arg_val_itr *ritr,size_t lsize,size_t rsize)

{
  int32_t iVar1;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  byte local_23;
  byte local_22;
  byte local_21;
  
  if (in_RDI[1] != in_RDX) {
    local_21 = 0;
    if (*(char *)*in_RDI != '-') goto LAB_00121cbd;
    iVar1 = rtosc_av_rep_num((rtosc_arg_val_t *)0x121c5b);
    local_21 = 0;
    if (iVar1 != 0) goto LAB_00121cbd;
  }
  local_22 = 1;
  if (in_RSI[1] != in_RCX) {
    local_23 = 0;
    if (*(char *)*in_RSI == '-') {
      iVar1 = rtosc_av_rep_num((rtosc_arg_val_t *)0x121ca1);
      local_23 = iVar1 != 0 ^ 0xff;
    }
    local_22 = local_23;
  }
  local_21 = local_22;
LAB_00121cbd:
  return (int)(local_21 & 1);
}

Assistant:

int rtosc_arg_vals_eq_after_abort(const rtosc_arg_val_itr* litr,
                                  const rtosc_arg_val_itr* ritr,
                                  size_t lsize, size_t rsize)
{
    return    (litr->i == lsize ||
                  (litr->av->type == '-' && !rtosc_av_rep_num(litr->av)))
           && (ritr->i == rsize ||
                  (ritr->av->type == '-' && !rtosc_av_rep_num(ritr->av)));
}